

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

Pubkey * cfd::core::SchnorrUtil::ComputeSigPoint
                   (Pubkey *__return_storage_ptr__,ByteData256 *msg,SchnorrPubkey *nonce,
                   SchnorrPubkey *pubkey)

{
  int iVar1;
  undefined8 uVar2;
  uchar *puVar3;
  CfdException *this;
  allocator local_141;
  string local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110 [28];
  int local_f4;
  undefined1 local_f0 [4];
  int ret;
  secp256k1_pubkey_conflict secp_sigpoint;
  secp256k1_xonly_pubkey secp_nonce;
  secp256k1_xonly_pubkey xonly_pubkey;
  secp256k1_context_struct *ctx;
  SchnorrPubkey *pubkey_local;
  SchnorrPubkey *nonce_local;
  ByteData256 *msg_local;
  
  uVar2 = wally_get_secp_context();
  ParseXOnlyPubkey((secp256k1_xonly_pubkey *)(secp_nonce.data + 0x38),pubkey);
  ParseXOnlyPubkey((secp256k1_xonly_pubkey *)(secp_sigpoint.data + 0x38),nonce);
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,msg);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_110);
  iVar1 = secp256k1_schnorrsig_compute_sigpoint
                    (uVar2,local_f0,puVar3,secp_sigpoint.data + 0x38,secp_nonce.data + 0x38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_110);
  local_f4 = iVar1;
  if (iVar1 != 1) {
    this = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_140,"Could not compute sigpoint",&local_141);
    CfdException::CfdException(this,kCfdInternalError,&local_140);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConvertSecpPubkey(__return_storage_ptr__,(secp256k1_pubkey_conflict *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

Pubkey SchnorrUtil::ComputeSigPoint(
    const ByteData256 &msg, const SchnorrPubkey &nonce,
    const SchnorrPubkey &pubkey) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey = ParseXOnlyPubkey(pubkey);

  secp256k1_xonly_pubkey secp_nonce = ParseXOnlyPubkey(nonce);

  secp256k1_pubkey secp_sigpoint;

  auto ret = secp256k1_schnorrsig_compute_sigpoint(
      ctx, &secp_sigpoint, msg.GetBytes().data(), &secp_nonce, &xonly_pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not compute sigpoint");
  }

  return ConvertSecpPubkey(secp_sigpoint);
}